

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_format_buffer(png_const_structrp png_ptr,png_charp buffer,png_const_charp error_message)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool local_36;
  int local_34;
  int iin;
  int c;
  int ishift;
  int iout;
  png_uint_32 chunk_name;
  png_const_charp error_message_local;
  png_charp buffer_local;
  png_const_structrp png_ptr_local;
  
  uVar1 = png_ptr->chunk_name;
  c = 0;
  iin = 0x18;
  while (-1 < iin) {
    uVar2 = uVar1 >> ((byte)iin & 0x1f);
    uVar3 = uVar2 & 0xff;
    iin = iin + -8;
    local_36 = true;
    if ((0x40 < uVar3) && (local_36 = true, uVar3 < 0x7b)) {
      local_36 = 0x5a < uVar3 && uVar3 < 0x61;
    }
    if (local_36) {
      buffer[c] = '[';
      buffer[c + 1] = "0123456789ABCDEF"[(int)(uVar2 & 0xf0) >> 4];
      buffer[c + 2] = "0123456789ABCDEF"[(int)(uVar2 & 0xf)];
      buffer[c + 3] = ']';
      c = c + 4;
    }
    else {
      buffer[c] = (char)uVar2;
      c = c + 1;
    }
  }
  if (error_message == (png_const_charp)0x0) {
    buffer[c] = '\0';
  }
  else {
    local_34 = 0;
    buffer[c] = ':';
    buffer[c + 1] = ' ';
    c = c + 2;
    while( true ) {
      bVar4 = false;
      if (local_34 < 0xc3) {
        bVar4 = error_message[local_34] != '\0';
      }
      if (!bVar4) break;
      buffer[c] = error_message[local_34];
      local_34 = local_34 + 1;
      c = c + 1;
    }
    buffer[c] = '\0';
  }
  return;
}

Assistant:

static void /* PRIVATE */
png_format_buffer(png_const_structrp png_ptr, png_charp buffer, png_const_charp
    error_message)
{
   png_uint_32 chunk_name = png_ptr->chunk_name;
   int iout = 0, ishift = 24;

   while (ishift >= 0)
   {
      int c = (int)(chunk_name >> ishift) & 0xff;

      ishift -= 8;
      if (isnonalpha(c) != 0)
      {
         buffer[iout++] = PNG_LITERAL_LEFT_SQUARE_BRACKET;
         buffer[iout++] = png_digit[(c & 0xf0) >> 4];
         buffer[iout++] = png_digit[c & 0x0f];
         buffer[iout++] = PNG_LITERAL_RIGHT_SQUARE_BRACKET;
      }

      else
      {
         buffer[iout++] = (char)c;
      }
   }

   if (error_message == NULL)
      buffer[iout] = '\0';

   else
   {
      int iin = 0;

      buffer[iout++] = ':';
      buffer[iout++] = ' ';

      while (iin < PNG_MAX_ERROR_TEXT-1 && error_message[iin] != '\0')
         buffer[iout++] = error_message[iin++];

      /* iin < PNG_MAX_ERROR_TEXT, so the following is safe: */
      buffer[iout] = '\0';
   }
}